

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::ReaderCapabilityTable::extractCap(ReaderCapabilityTable *this,uint index)

{
  long *plVar1;
  ClientHook *in_RDX;
  ClientHook *extraout_RDX;
  undefined4 in_register_00000034;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar2;
  CapTableReader local_20;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *local_18;
  
  if (((ulong)in_RDX & 0xffffffff) < *(ulong *)(CONCAT44(in_register_00000034,index) + 0x10)) {
    plVar1 = *(long **)(*(long *)(CONCAT44(in_register_00000034,index) + 8) + 8 +
                       ((ulong)in_RDX & 0xffffffff) * 0x10);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x20))(&local_20);
      (this->super_CapTableReader)._vptr_CapTableReader = local_20._vptr_CapTableReader;
      (this->table).ptr = local_18;
      in_RDX = extraout_RDX;
      goto LAB_0021cbbe;
    }
  }
  (this->super_CapTableReader)._vptr_CapTableReader = (_func_int **)0x0;
  (this->table).ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
LAB_0021cbbe:
  MVar2.ptr.ptr = in_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> ReaderCapabilityTable::extractCap(uint index) {
  if (index < table.size()) {
    return table[index].map([](kj::Own<ClientHook>& cap) { return cap->addRef(); });
  } else {
    return kj::none;
  }
}